

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O3

CURLcode tftp_set_timeouts(tftp_state_data_t *state)

{
  tftp_state_t tVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  CURLcode CVar10;
  
  tVar1 = state->state;
  time(&state->start_time);
  lVar3 = Curl_timeleft(state->conn->data,(timeval *)0x0,tVar1 == TFTP_STATE_START);
  if (lVar3 < 0) {
    Curl_failf(state->conn->data,"Connection time-out");
    CVar10 = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    if (tVar1 == TFTP_STATE_START) {
      uVar4 = (lVar3 + 500U) / 1000;
      lVar6 = state->start_time;
      lVar3 = lVar6 + uVar4;
      state->max_time = lVar3;
      uVar9 = 1;
      if (4 < (int)uVar4) {
        uVar9 = (ulong)(uint)((int)uVar4 / 5);
      }
    }
    else {
      if (lVar3 == 0) {
        uVar4 = 0xe10;
      }
      else {
        uVar4 = (lVar3 + 500U) / 1000;
      }
      lVar6 = state->start_time;
      lVar3 = lVar6 + uVar4;
      state->max_time = lVar3;
      uVar9 = (ulong)(uint)((int)uVar4 / 5);
    }
    uVar8 = (uint)uVar9;
    state->retry_max = uVar8;
    uVar5 = 3;
    if (((int)uVar8 < 3) || (uVar5 = 0x32, 0x32 < uVar8)) {
      state->retry_max = uVar5;
      uVar9 = (ulong)uVar5;
    }
    CVar10 = CURLE_OK;
    iVar2 = (int)(uVar4 / uVar9);
    iVar7 = 1;
    if (1 < iVar2) {
      iVar7 = iVar2;
    }
    state->retry_time = iVar7;
    Curl_infof(state->conn->data,"set timeouts for state %d; Total %ld, retry %d maxtry %d\n",
               (ulong)state->state,lVar3 - lVar6);
    time(&state->rx_time);
  }
  return CVar10;
}

Assistant:

static CURLcode tftp_set_timeouts(tftp_state_data_t *state)
{
  time_t maxtime, timeout;
  long timeout_ms;
  bool start = (state->state == TFTP_STATE_START) ? TRUE : FALSE;

  time(&state->start_time);

  /* Compute drop-dead time */
  timeout_ms = Curl_timeleft(state->conn->data, NULL, start);

  if(timeout_ms < 0) {
    /* time-out, bail out, go home */
    failf(state->conn->data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(start) {

    maxtime = (time_t)(timeout_ms + 500) / 1000;
    state->max_time = state->start_time+maxtime;

    /* Set per-block timeout to total */
    timeout = maxtime ;

    /* Average restart after 5 seconds */
    state->retry_max = (int)timeout/5;

    if(state->retry_max < 1)
      /* avoid division by zero below */
      state->retry_max = 1;

    /* Compute the re-start interval to suit the timeout */
    state->retry_time = (int)timeout/state->retry_max;
    if(state->retry_time<1)
      state->retry_time=1;

  }
  else {
    if(timeout_ms > 0)
      maxtime = (time_t)(timeout_ms + 500) / 1000;
    else
      maxtime = 3600;

    state->max_time = state->start_time+maxtime;

    /* Set per-block timeout to total */
    timeout = maxtime;

    /* Average reposting an ACK after 5 seconds */
    state->retry_max = (int)timeout/5;
  }
  /* But bound the total number */
  if(state->retry_max<3)
    state->retry_max=3;

  if(state->retry_max>50)
    state->retry_max=50;

  /* Compute the re-ACK interval to suit the timeout */
  state->retry_time = (int)(timeout/state->retry_max);
  if(state->retry_time<1)
    state->retry_time=1;

  infof(state->conn->data,
        "set timeouts for state %d; Total %ld, retry %d maxtry %d\n",
        (int)state->state, (long)(state->max_time-state->start_time),
        state->retry_time, state->retry_max);

  /* init RX time */
  time(&state->rx_time);

  return CURLE_OK;
}